

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::LoadRange(DBImpl *this,string *fname,string *start,string *end)

{
  Table *pTVar1;
  string *psVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  char *pcVar6;
  char *in_R8;
  Slice SVar7;
  WriteOptions local_181;
  Status local_180;
  Slice local_178;
  Slice local_168;
  Slice local_158;
  Slice local_148;
  Slice local_138;
  Slice local_128;
  undefined1 local_118 [8];
  WriteBatch batch;
  Iterator *iter;
  ReadOptions readoptions;
  Table local_d8;
  undefined1 local_d0 [8];
  Options options;
  Status local_58;
  Table *local_50;
  Table *table;
  RandomAccessFile *file;
  uint64_t file_size;
  char *local_30;
  string *end_local;
  string *start_local;
  string *fname_local;
  DBImpl *this_local;
  Status *s;
  
  file_size._7_1_ = 0;
  local_30 = in_R8;
  end_local = end;
  start_local = start;
  fname_local = fname;
  this_local = this;
  Status::Status((Status *)this);
  table = (Table *)0x0;
  local_50 = (Table *)0x0;
  (**(code **)(**(long **)(fname + 8) + 0x58))(&local_58,*(long **)(fname + 8),start_local,&file);
  Status::operator=((Status *)this,&local_58);
  Status::~Status(&local_58);
  bVar3 = Status::ok((Status *)this);
  if (bVar3) {
    (**(code **)(**(long **)(fname + 8) + 0x18))
              (&options.filter_policy,*(long **)(fname + 8),start_local,&table);
    Status::operator=((Status *)this,(Status *)&options.filter_policy);
    Status::~Status((Status *)&options.filter_policy);
  }
  Options::Options((Options *)local_d0);
  options.compression = kNoCompression;
  options.reuse_logs = false;
  options._85_3_ = 0;
  options.max_file_size._0_4_ = 1;
  bVar3 = Status::ok((Status *)this);
  if (bVar3) {
    Table::Open(&local_d8,(Options *)local_d0,(RandomAccessFile *)table,(uint64_t)file,&local_50);
    Status::operator=((Status *)this,(Status *)&local_d8);
    Status::~Status((Status *)&local_d8);
  }
  bVar3 = Status::ok((Status *)this);
  pTVar1 = local_50;
  if (bVar3) {
    ReadOptions::ReadOptions((ReadOptions *)&iter);
    iter._1_1_ = 1;
    batch._24_8_ = Table::NewIterator(local_50,(ReadOptions *)&iter);
    WriteBatch::WriteBatch((WriteBatch *)local_118);
    (**(code **)(*(long *)batch._24_8_ + 0x18))();
    psVar2 = end_local;
    local_128 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
    pcVar5 = Slice::data(&local_128);
    local_138 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
    Slice::size(&local_138);
    std::__cxx11::string::assign((char *)psVar2,(ulong)pcVar5);
    while( true ) {
      bVar4 = (**(code **)(*(long *)batch._24_8_ + 0x10))();
      pcVar5 = local_30;
      if ((bVar4 & 1) == 0) break;
      SVar7 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
      local_148 = SVar7;
      pcVar6 = Slice::data(&local_148);
      SVar7 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
      local_158 = SVar7;
      Slice::size(&local_158);
      std::__cxx11::string::assign(pcVar5,(ulong)pcVar6);
      SVar7 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
      local_168 = SVar7;
      SVar7 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x48))();
      local_178 = SVar7;
      WriteBatch::Put((WriteBatch *)local_118,&local_168,&local_178);
      (**(code **)(*(long *)batch._24_8_ + 0x30))();
    }
    local_181.sync = false;
    WriteOptions::WriteOptions(&local_181);
    (**(code **)(*(long *)fname + 0x20))(&local_180,fname,&local_181,local_118);
    Status::operator=((Status *)this,&local_180);
    Status::~Status(&local_180);
    if (batch._24_8_ != 0) {
      (**(code **)(*(long *)batch._24_8_ + 8))();
    }
    pTVar1 = local_50;
    if (local_50 != (Table *)0x0) {
      Table::~Table(local_50);
      operator_delete(pTVar1);
    }
    if (table != (Table *)0x0) {
      (**(code **)&(table->rep_->options).create_if_missing)();
    }
    file_size._7_1_ = 1;
    readoptions.snapshot._4_4_ = 1;
    WriteBatch::~WriteBatch((WriteBatch *)local_118);
  }
  else {
    if (local_50 != (Table *)0x0) {
      Table::~Table(local_50);
      operator_delete(pTVar1);
    }
    if (table != (Table *)0x0) {
      (**(code **)&(table->rep_->options).create_if_missing)();
    }
    file_size._7_1_ = 1;
    readoptions.snapshot._4_4_ = 1;
  }
  if ((file_size._7_1_ & 1) == 0) {
    Status::~Status((Status *)this);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::LoadRange(const std::string& fname,
                   std::string* start, 
                   std::string* end){
  Status s;
  uint64_t file_size;
  RandomAccessFile* file = nullptr;
  Table* table = nullptr;

  s = env_->GetFileSize(fname, &file_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(fname, &file);
  }

  Options options;
  options.filter_policy = nullptr;
  options.compression = kSnappyCompression;
  if (s.ok()) {
    s = Table::Open(options, file, file_size, &table);
  }

  if (!s.ok()) {
    delete table;
    delete file;
    return s;
  }

  ReadOptions readoptions;
  readoptions.fill_cache = true;
  Iterator* iter = table->NewIterator(readoptions);
  WriteBatch batch;
  //printf("START LOADING...");
  iter->SeekToFirst();
  start->assign(iter->key().data(), iter->key().size());
  for (; iter->Valid(); iter->Next()) {
    end->assign(iter->key().data(), iter->key().size());
    //printf("LOAD Key: [%s], value: [%s]\n", iter->key().ToString().c_str(), iter->value().ToString().c_str());
    batch.Put(iter->key(), iter->value());
  }
  s = Write(WriteOptions(), &batch);
  
  delete iter;
  delete table;
  delete file;
  return s;
}